

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration_x11.cpp
# Opt level: O0

bool __thiscall
QOffscreenX11GLXContext::makeCurrent(QOffscreenX11GLXContext *this,QPlatformSurface *surface)

{
  long lVar1;
  Window WVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  Display *pDVar7;
  QOffscreenX11GLXContextData *pQVar8;
  long in_RDI;
  long in_FS_OFFSET;
  QSize size;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  plVar6 = (long *)QPlatformSurface::surface();
  (**(code **)(*plVar6 + 0x28))();
  QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>::
  operator->((QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
              *)(in_RDI + 0x18));
  pDVar7 = QOffscreenX11Info::display((QOffscreenX11Info *)0x128ae4);
  pQVar8 = QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
           ::operator->((QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
                         *)(in_RDI + 0x18));
  WVar2 = pQVar8->window;
  iVar3 = QSize::width((QSize *)0x128b0a);
  iVar4 = QSize::height((QSize *)0x128b18);
  XResizeWindow(pDVar7,WVar2,iVar3,iVar4);
  QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>::
  operator->((QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
              *)(in_RDI + 0x18));
  pDVar7 = QOffscreenX11Info::display((QOffscreenX11Info *)0x128b43);
  XSync(pDVar7,1);
  QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>::
  operator->((QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
              *)(in_RDI + 0x18));
  pDVar7 = QOffscreenX11Info::display((QOffscreenX11Info *)0x128b66);
  pQVar8 = QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
           ::operator->((QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
                         *)(in_RDI + 0x18));
  WVar2 = pQVar8->window;
  pQVar8 = QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
           ::operator->((QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
                         *)(in_RDI + 0x18));
  iVar3 = glXMakeCurrent(pDVar7,WVar2,pQVar8->context);
  if (iVar3 != 0) {
    iVar4 = QSize::width((QSize *)0x128bb2);
    iVar5 = QSize::height((QSize *)0x128bc0);
    glViewport(0,0,iVar4,iVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar3 != 0;
}

Assistant:

bool QOffscreenX11GLXContext::makeCurrent(QPlatformSurface *surface)
{
    QSize size = surface->surface()->size();

    XResizeWindow(d->x11->display(), d->window, size.width(), size.height());
    XSync(d->x11->display(), true);

    if (glXMakeCurrent(d->x11->display(), d->window, d->context)) {
        glViewport(0, 0, size.width(), size.height());
        return true;
    }

    return false;
}